

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpersTest.cpp
# Opt level: O2

void __thiscall Types_TypeName_Test::Types_TypeName_Test(Types_TypeName_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014aa60;
  return;
}

Assistant:

TEST(Types, TypeName) {
    std::string int_name = CLI::detail::type_name<int>();
    EXPECT_EQ("INT", int_name);

    std::string int2_name = CLI::detail::type_name<short>();
    EXPECT_EQ("INT", int2_name);

    std::string uint_name = CLI::detail::type_name<unsigned char>();
    EXPECT_EQ("UINT", uint_name);

    std::string float_name = CLI::detail::type_name<double>();
    EXPECT_EQ("FLOAT", float_name);

    std::string vector_name = CLI::detail::type_name<std::vector<int>>();
    EXPECT_EQ("VECTOR", vector_name);

    std::string text_name = CLI::detail::type_name<std::string>();
    EXPECT_EQ("TEXT", text_name);

    std::string text2_name = CLI::detail::type_name<char *>();
    EXPECT_EQ("TEXT", text2_name);
}